

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_bitwiseAndVecScalar_ivec3(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  Vector<int,_3> res;
  Vector<int,_3> res_1;
  Vector<float,_3> res_2;
  uint local_28 [7];
  float local_c;
  undefined8 local_8;
  
  local_c = c->in[0].m_data[2];
  local_8 = *(undefined8 *)c->in[0].m_data;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] = (int)(&local_c)[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_28[0] = (uint)c->in[1].m_data[0];
  local_28[1] = local_28[0];
  local_28[2] = local_28[0];
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  res_1.m_data[2] = 0;
  lVar1 = 0;
  do {
    res_1.m_data[lVar1] = local_28[lVar1] & res.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  lVar1 = 0;
  do {
    res_2.m_data[lVar1] = (float)res_1.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_28[2] = 0;
  local_28[3] = 1;
  local_28[4] = 2;
  lVar1 = 2;
  do {
    (c->color).m_data[(int)local_28[lVar1]] = (float)res_1.m_data[lVar1 + 2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }